

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

Oop __thiscall Lodtalk::MethodCompiler::visitSequenceNode(MethodCompiler *this,SequenceNode *node)

{
  pointer ppNVar1;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar2;
  bool bVar3;
  Node **child;
  pointer ppNVar4;
  
  pvVar2 = AST::SequenceNode::getChildren(node);
  ppNVar4 = (pvVar2->super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (pvVar2->super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar4 != ppNVar1) {
    bVar3 = true;
    do {
      if (bVar3) {
        bVar3 = false;
      }
      else {
        MethodAssembler::Assembler::popStackTop(&this->gen);
      }
      (*(*ppNVar4)->_vptr_Node[2])(*ppNVar4,this);
      ppNVar4 = ppNVar4 + 1;
    } while (ppNVar4 != ppNVar1);
  }
  return (Oop)&NilObject;
}

Assistant:

Oop MethodCompiler::visitSequenceNode(SequenceNode *node)
{
	bool first = true;
	for(auto &child : node->getChildren())
	{
		if(first)
			first = false;
		else
			gen.popStackTop();

		child->acceptVisitor(this);
	}

	return Oop();
}